

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  int *piVar1;
  int iVar2;
  ImGuiInputEvent *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiInputEvent *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  if (&GImGui->IO != this) {
    __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x55c,"void ImGuiIO::AddMouseButtonEvent(int, bool)");
  }
  if ((uint)mouse_button < 5) {
    if (this->AppAcceptingEvents == true) {
      iVar6 = (GImGui->InputEventsQueue).Size;
      iVar2 = (GImGui->InputEventsQueue).Capacity;
      if (iVar6 == iVar2) {
        iVar6 = iVar6 + 1;
        if (iVar2 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar2 / 2 + iVar2;
        }
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        if (iVar2 < iVar6) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (ImGuiInputEvent *)
                   (*GImAllocatorAllocFunc)((long)iVar6 * 0x18,GImAllocatorUserData);
          pIVar3 = (pIVar4->InputEventsQueue).Data;
          if (pIVar3 != (ImGuiInputEvent *)0x0) {
            memcpy(__dest,pIVar3,(long)(pIVar4->InputEventsQueue).Size * 0x18);
            pIVar3 = (pIVar4->InputEventsQueue).Data;
            if ((pIVar3 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
          }
          (pIVar4->InputEventsQueue).Data = __dest;
          (pIVar4->InputEventsQueue).Capacity = iVar6;
        }
      }
      pIVar3 = (pIVar4->InputEventsQueue).Data;
      iVar6 = (pIVar4->InputEventsQueue).Size;
      pIVar3[iVar6].Type = ImGuiInputEventType_MouseButton;
      pIVar3[iVar6].Source = ImGuiInputSource_Mouse;
      pIVar3[iVar6].field_2.MouseButton.Button = mouse_button;
      pIVar3[iVar6].field_2.MouseButton.Down = down;
      *(undefined8 *)((long)&pIVar3[iVar6].field_2 + 5) = 0;
      *(undefined4 *)&pIVar3[iVar6].AddedByTestEngine = 0;
      (pIVar4->InputEventsQueue).Size = (pIVar4->InputEventsQueue).Size + 1;
    }
    return;
  }
  __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x55d,"void ImGuiIO::AddMouseButtonEvent(int, bool)");
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
    if (!AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}